

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall ON_SubDMeshFragment::SetColors(ON_SubDMeshFragment *this,ON_Color color)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ON_Color *pOVar5;
  ON_Color *c1;
  ON_Color *c;
  size_t stride;
  size_t capacity;
  ON_SubDMeshFragment *this_local;
  ON_Color color_local;
  
  this_local._4_4_ = color.field_0;
  uVar3 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
  uVar4 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)((long)&this_local + 4));
  if (uVar3 == uVar4) {
    ClearColors(this);
  }
  else {
    this->m_ctrlnetC[0].field_0 = this_local._4_4_;
    this->m_ctrlnetC[1].field_0 = this_local._4_4_;
    this->m_ctrlnetC[2].field_0 = this_local._4_4_;
    this->m_ctrlnetC[3].field_0 = this_local._4_4_;
    uVar3 = ColorCapacity(this);
    if ((ulong)uVar3 != 0) {
      sVar1 = this->m_C_stride;
      c1 = this->m_C;
      pOVar5 = c1 + uVar3 * sVar1;
      for (; c1 < pOVar5; c1 = c1 + sVar1) {
        c1->field_0 = this_local._4_4_;
      }
    }
    SetColorsExistForExperts(this,true);
  }
  bVar2 = ColorsExistForExperts(this);
  return bVar2;
}

Assistant:

bool ON_SubDMeshFragment::SetColors(ON_Color color) const
{
  if (ON_Color::UnsetColor == color)
  {
    ClearColors();
  }
  else
  {
    m_ctrlnetC[0] = color;
    m_ctrlnetC[1] = color;
    m_ctrlnetC[2] = color;
    m_ctrlnetC[3] = color;

    const size_t capacity = ColorCapacity();
    if (capacity > 0)
    {
      const size_t stride = m_C_stride;
      ON_Color* c = m_C;
      ON_Color* c1 = c + capacity * stride;
      while (c < c1)
      {
        *c = color;
        c += stride;
      }
    }
    this->SetColorsExistForExperts(true);
  }
  return ColorsExistForExperts();
}